

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateModuleGlobalVariableInformation(ExpressionTranslateContext *ctx)

{
  VariableData *variable;
  VariableData **ppVVar1;
  ScopeData *pSVar2;
  uint i;
  uint index;
  
  PrintIndentedLine(ctx,"// Register globals");
  index = 0;
  do {
    if ((ctx->ctx->variables).count <= index) {
      PrintLine(ctx);
      return;
    }
    ppVVar1 = SmallArray<VariableData_*,_128U>::operator[](&ctx->ctx->variables,index);
    variable = *ppVVar1;
    if ((variable->isVmAlloca == false) && (variable->importModule == (ModuleData *)0x0)) {
      pSVar2 = variable->scope;
      if ((pSVar2 != ctx->ctx->globalScope) && (pSVar2->ownerNamespace == (NamespaceData *)0x0)) {
        pSVar2 = ExpressionContext::GlobalScopeFrom(ctx->ctx,pSVar2);
        if (pSVar2 == (ScopeData *)0x0) goto LAB_00141d95;
      }
      PrintIndent(ctx);
      Print(ctx,"__nullcRegisterGlobal((void*)&");
      TranslateVariableName(ctx,variable);
      Print(ctx,", __nullcTR[%d]);",(ulong)variable->type->typeIndex);
      PrintLine(ctx);
    }
LAB_00141d95:
    index = index + 1;
  } while( true );
}

Assistant:

void TranslateModuleGlobalVariableInformation(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Register globals");

	for(unsigned int i = 0; i < ctx.ctx.variables.size(); i++)
	{
		VariableData *variable = ctx.ctx.variables[i];

		// Don't need variables allocated by intermediate vm compilation
		if(variable->isVmAlloca)
			continue;

		if(variable->importModule)
			continue;

		if(variable->scope == ctx.ctx.globalScope || variable->scope->ownerNamespace || ctx.ctx.GlobalScopeFrom(variable->scope))
		{
			PrintIndent(ctx);
			Print(ctx, "__nullcRegisterGlobal((void*)&");
			TranslateVariableName(ctx, variable);
			Print(ctx, ", __nullcTR[%d]);", variable->type->typeIndex);
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}